

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O0

ufile_error ufile_multiple_upload_abort(ufile_mutipart_state *self)

{
  CURL *curl_00;
  uint uVar1;
  list_node *node_00;
  curls_list *pcVar2;
  ufile_error uVar3;
  char local_88 [8];
  char query [64];
  http_options opt;
  CURL *curl;
  list_node *node;
  ufile_mutipart_state *self_local;
  ufile_error error;
  
  node_00 = get_curl_handle(self->curls);
  if (node_00 == (list_node *)0x0) {
    self_local = (ufile_mutipart_state *)0xfffffffb;
    error._0_8_ = anon_var_dwarf_5907;
  }
  else {
    curl_00 = node_00->curl;
    memset(query + 0x38,0,0x18);
    memset(local_88,0,0x40);
    sprintf(local_88,"uploadId=%s",self->upload_id);
    uVar3 = set_http_options((http_options *)(query + 0x38),"DELETE","",self->bucket_name,self->key,
                             local_88);
    error._0_8_ = uVar3.message;
    uVar1 = uVar3.code;
    self_local = (ufile_mutipart_state *)(ulong)uVar1;
    if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
      set_curl_options(curl_00,(http_options *)(query + 0x38));
      curl_easy_setopt(curl_00,0x2c,1);
      uVar3 = curl_do(curl_00);
      error._0_8_ = uVar3.message;
      self_local = (ufile_mutipart_state *)(ulong)(uint)uVar3.code;
      http_cleanup((CURL *)0x0,(http_options *)(query + 0x38));
    }
  }
  pcVar2 = save_curl_handle(self->curls,node_00);
  self->curls = pcVar2;
  free_state(self);
  uVar3.message = (char *)error._0_8_;
  uVar3._0_8_ = self_local;
  return uVar3;
}

Assistant:

struct ufile_error
ufile_multiple_upload_abort(struct ufile_mutipart_state *self){
    struct ufile_error error=NO_ERROR;
    struct list_node *node = get_curl_handle(self->curls);
    if(node == NULL){
        error.code = UFILE_MULTIPLE_NOT_FINISH_ERROR_CODE;
        error.message = "Other upload_part have not finish yet, please check your code calling order.";
        goto FAILED;
    }
    CURL *curl = node->curl;

    struct http_options opt;
    memset(&opt, 0, sizeof(struct http_options));
    char query[64]={0};
    sprintf(query, "uploadId=%s",self->upload_id);
    error = set_http_options(&opt, "DELETE", "", self->bucket_name, self->key, query);
    if(UFILE_HAS_ERROR(error.code)){
        //set_http_options 在错误时不会分配内存，所以不需要释放。
        goto FAILED;
    }

    set_curl_options(curl, &opt);
    curl_easy_setopt(curl, CURLOPT_NOBODY, 1);
    error = curl_do(curl);
    http_cleanup(NULL, &opt);

FAILED:
    self->curls = save_curl_handle(self->curls, node); //把 curl 还回去，由 free_state 统一释放资源
    free_state(self);
    return error;
}